

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int lexan(void)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  bool bVar5;
  int local_1c;
  int fractional;
  int insCode;
  int cnt;
  int rc;
  int t;
  int p;
  
  do {
    do {
      cVar1 = *inputStr;
      inputStr = inputStr + 1;
      insCode = toupper((int)cVar1);
    } while (insCode == 0x20);
  } while (((insCode == 9) || (insCode == 10)) || (insCode == 0xd));
  ppuVar4 = __ctype_b_loc();
  if ((((*ppuVar4)[insCode] & 0x800) == 0) && (insCode != 0x2e)) {
    if ((((insCode == 0x4e) && (iVar3 = toupper((int)*inputStr), iVar3 == 0x4f)) &&
        (iVar3 = toupper((int)inputStr[1]), iVar3 == 0x54)) &&
       (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)inputStr[2]] & 8) == 0)) {
      inputStr = inputStr + 2;
      tokenval = 0;
      insCode = 400;
    }
    else if ((((insCode == 0x57) && (iVar3 = toupper((int)*inputStr), iVar3 == 0x49)) &&
             ((iVar3 = toupper((int)inputStr[1]), iVar3 == 0x54 &&
              ((iVar3 = toupper((int)inputStr[2]), iVar3 == 0x48 &&
               (iVar3 = toupper((int)inputStr[3]), iVar3 == 0x49)))))) &&
            ((iVar3 = toupper((int)inputStr[4]), iVar3 == 0x4e &&
             (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)inputStr[5]] & 8) == 0)))) {
      inputStr = inputStr + 5;
      tokenval = 0;
      insCode = 0x194;
    }
    else {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[insCode] & 0x400) == 0) {
        if (insCode == 0) {
          tokenval = 0;
          insCode = 0x195;
        }
        else {
          tokenval = 0;
        }
      }
      else {
        fractional = 0;
        lexbuf[0] = (char)insCode;
        while( true ) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = true;
          if ((((((*ppuVar4)[(int)*inputStr] & 8) == 0) && (bVar5 = true, *inputStr != '_')) &&
              (bVar5 = true, *inputStr != '*')) && (bVar5 = true, *inputStr != '\'')) {
            bVar5 = *inputStr == '\"';
          }
          if (!bVar5) break;
          if (0x62 < fractional) {
            halt("symbol too long");
          }
          cVar1 = *inputStr;
          inputStr = inputStr + 1;
          iVar3 = toupper((int)cVar1);
          fractional = fractional + 1;
          lexbuf[fractional] = (char)iVar3;
        }
        lexbuf[fractional + 1] = '\0';
        rc = lookup(lexbuf);
        if (rc == 0) {
          rc = insert(lexbuf,0x193);
        }
        tokenval = rc;
        insCode = 0x193;
      }
    }
  }
  else {
    local_1c = 0;
    bVar5 = insCode == 0x2e;
    fractional = 0;
    lexbuf[0] = (char)insCode;
    while( true ) {
      ppuVar4 = __ctype_b_loc();
      bVar2 = true;
      if ((((*ppuVar4)[(int)*inputStr] & 0x800) == 0) &&
         (((*inputStr == '.' ||
           (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*inputStr] & 0x400) != 0)) ||
          (bVar2 = false, *inputStr == '_')))) {
        bVar2 = local_1c == 0 && !bVar5;
      }
      if (!bVar2) break;
      if (*inputStr == '.') {
        bVar5 = true;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        if (((*ppuVar4)[(int)*inputStr] & 0x400) == 0) {
          if (*inputStr == '_') {
            local_1c = 0x20;
          }
        }
        else {
          local_1c = toupper((int)*inputStr);
        }
      }
      if (0x62 < fractional) {
        halt("number too long");
      }
      cVar1 = *inputStr;
      inputStr = inputStr + 1;
      iVar3 = toupper((int)cVar1);
      fractional = fractional + 1;
      lexbuf[fractional] = (char)iVar3;
    }
    iVar3 = fractional + 1;
    lexbuf[iVar3] = '\0';
    if (bVar5) {
      realtokval = parseReal(lexbuf,0,iVar3);
      tokenval = 0;
      insCode = 0x192;
    }
    else {
      tokenval = parseInteger(lexbuf,0,iVar3);
      if (local_1c != 0) {
        lexbuf[0] = (char)local_1c;
      }
      fractional = (int)(local_1c != 0);
      lexbuf[fractional] = '\0';
      insCode = 0x191;
    }
  }
  return insCode;
}

Assistant:

int lexan() {
   int p, t, rc, cnt;
   
   for (;;) {
      t = toupper(*inputStr++);
      if (t == ' ' || t == '\t' || t == '\n' || t == '\r') {
	 /* skip over whitespace  */
      }
      else if (isdigit(t) || t == '.') {
	 int insCode = 0;
	 int fractional = (t == '.');
	 lexbuf[cnt = 0] = t;
	 while ( isdigit(*inputStr)
	    || (  (*inputStr == '.' ||
	            isalpha(*inputStr) || *inputStr == '_')
	      && ! (insCode || fractional)) ) {

	         if (*inputStr == '.')   { fractional = 1;               }
	    else if (isalpha(*inputStr)) { insCode = toupper(*inputStr); }
	    else if (*inputStr == '_')   { insCode = ' ';                }
	    if (cnt >= LXBUFSZ-1) { halt("number too long"); }
	    lexbuf[++cnt] = toupper(*inputStr++);
	 }
	 lexbuf[++cnt] = '\0';

	 if (fractional) {
	    realtokval = parseReal(lexbuf, 0, cnt);
	    tokenval = 0;
	    rc = REALNUM_TOK;
	 }
	 else { /* need to save insCode */
	    tokenval = parseInteger(lexbuf, 0, cnt);
            cnt = 0;
	    if (insCode) { lexbuf[cnt++] = insCode; }
	    lexbuf[cnt] = '\0';
	    rc = NUM_TOK;
	 }
	 break;
      }
      else if (t == 'N' && toupper(inputStr[0]) == 'O'
           && toupper(inputStr[1]) == 'T' && !isalnum(inputStr[2]) ) {
	 inputStr++;
	 inputStr++;
	 tokenval = 0;
	 rc = NOT_TOK;
	 break;
      }
      else if (t == 'W' && toupper(inputStr[0]) == 'I'
           && toupper(inputStr[1]) == 'T' && toupper(inputStr[2]) == 'H'
           && toupper(inputStr[3]) == 'I' && toupper(inputStr[4]) == 'N'
	   && !isalnum(inputStr[5]) ) {
	 inputStr += 5;
	 tokenval = 0;
	 rc = WITHIN_TOK;
	 break;
      }
      else if (isalpha(t)) {
	 lexbuf[cnt = 0] = t;
	 while (isalnum(*inputStr) || (*inputStr == '_')
	     || (*inputStr == '*') || (*inputStr == '\'')
	     || (*inputStr == '"')) {
	    if (cnt >= LXBUFSZ-1) { halt("symbol too long"); }
	    lexbuf[++cnt] = toupper(*inputStr++);
	 }
	 lexbuf[++cnt] = '\0';

	 p = lookup(lexbuf);
	 if (p == 0) {
	    p = insert(lexbuf, ID_TOK);
	 }
	 tokenval = p;
	 rc = ID_TOK;
	 break;
      }
      else if (t == '\0') {
	 tokenval = 0;
	 rc = DONE_TOK;
	 break;
      }
      else {
	 tokenval = 0;
	 rc = t;
	 break;
      }
   }
   return rc;
}